

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

deUint32 __thiscall glu::sl::ShaderParser::getShaderStageLiteralFlag(ShaderParser *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ShaderParser *local_18;
  ShaderParser *this_local;
  
  switch(this->m_curToken) {
  case TOKEN_VERTEX:
    this_local._4_4_ = 1;
    break;
  case TOKEN_FRAGMENT:
    this_local._4_4_ = 2;
    break;
  default:
    local_18 = this;
    std::__cxx11::string::string((string *)&local_78);
    std::operator+(&local_58,&local_78,"invalid shader stage name, got ");
    std::operator+(&local_38,&local_58,&this->m_curTokenStr);
    parseError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this_local._4_4_ = 0;
    break;
  case TOKEN_TESSELLATION_CONTROL:
    this_local._4_4_ = 8;
    break;
  case TOKEN_TESSELLATION_EVALUATION:
    this_local._4_4_ = 0x10;
    break;
  case TOKEN_GEOMETRY:
    this_local._4_4_ = 4;
  }
  return this_local._4_4_;
}

Assistant:

deUint32 ShaderParser::getShaderStageLiteralFlag (void)
{
	switch (m_curToken)
	{
		case TOKEN_VERTEX:					return (1 << glu::SHADERTYPE_VERTEX);
		case TOKEN_FRAGMENT:				return (1 << glu::SHADERTYPE_FRAGMENT);
		case TOKEN_GEOMETRY:				return (1 << glu::SHADERTYPE_GEOMETRY);
		case TOKEN_TESSELLATION_CONTROL:	return (1 << glu::SHADERTYPE_TESSELLATION_CONTROL);
		case TOKEN_TESSELLATION_EVALUATION:	return (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION);

		default:
			parseError(std::string() + "invalid shader stage name, got " + m_curTokenStr);
			return 0;
	}
}